

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

int __thiscall Liby::Timestamp::compareTo(Timestamp *this,Timestamp *rhs)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (this->tv_).tv_sec;
  lVar2 = (rhs->tv_).tv_sec;
  if (lVar2 <= lVar1) {
    if (lVar2 < lVar1) {
      return 1;
    }
    lVar1 = (this->tv_).tv_usec;
    lVar2 = (rhs->tv_).tv_usec;
    if (lVar2 <= lVar1) {
      return (int)(lVar2 < lVar1);
    }
  }
  return -1;
}

Assistant:

int compareTo(const Timestamp &rhs) const {
        if (rhs.tv_.tv_sec > tv_.tv_sec) {
            return -1;
        } else if (rhs.tv_.tv_sec < tv_.tv_sec) {
            return 1;
        } else {
            if (rhs.tv_.tv_usec > tv_.tv_usec) {
                return -1;
            } else if (rhs.tv_.tv_usec < tv_.tv_usec) {
                return 1;
            } else {
                return 0;
            }
        }
    }